

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O2

Gia_Man_t * Gia_ManInterTest(Gia_Man_t *p)

{
  uint *puVar1;
  int *piVar2;
  sat_solver2 *psVar3;
  Vec_Int_t *p_00;
  uint uVar4;
  abctime aVar5;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  void *pvVar6;
  Int2_Man_t *pIVar7;
  Gia_Man_t *p_02;
  uint uVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  long lVar12;
  int Lit;
  int local_70;
  int local_6c;
  sat_solver2 *local_68;
  ulong local_60;
  int local_54;
  int local_50;
  int local_4c;
  Vec_Int_t *local_48;
  Aig_Man_t *local_40;
  abctime local_38;
  
  aVar5 = Abc_Clock();
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa8,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  if (p->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                  ,0xa9,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
  }
  pAig = Gia_ManToAigSimple(p);
  p_01 = Cnf_Derive(pAig,1);
  local_68 = sat_solver2_new();
  local_68->fVerbose = 1;
  sat_solver2_setnvars(local_68,p_01->nVars * 2 + 1);
  for (iVar9 = 0; psVar3 = local_68, iVar9 < pAig->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar6 = Vec_PtrEntry(pAig->vObjs,iVar9);
    if (((pvVar6 != (void *)0x0) && (-1 < p_01->pVarNums[*(int *)((long)pvVar6 + 0x24)])) &&
       ((*(uint *)((long)pvVar6 + 0x18) & 6) != 2)) {
      var_set_partA(local_68,p_01->pVarNums[*(int *)((long)pvVar6 + 0x24)],1);
    }
  }
  local_38 = aVar5;
  for (lVar12 = 0; lVar12 < p_01->nClauses; lVar12 = lVar12 + 1) {
    uVar4 = sat_solver2_addclause(psVar3,p_01->pClauses[lVar12],p_01->pClauses[lVar12 + 1],-1);
    uVar8 = (psVar3->Mem).uPageMask & uVar4;
    if (uVar8 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                    ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar1 = (uint *)((psVar3->Mem).pPages[(int)uVar4 >> ((byte)(psVar3->Mem).nPageSize & 0x1f)] +
                     (int)uVar8);
    *puVar1 = *puVar1 | 4;
  }
  Cnf_DataLift(p_01,p_01->nVars);
  for (lVar12 = 0; lVar12 < p_01->nClauses; lVar12 = lVar12 + 1) {
    sat_solver2_addclause(psVar3,p_01->pClauses[lVar12],p_01->pClauses[lVar12 + 1],-1);
  }
  Cnf_DataLift(p_01,-p_01->nVars);
  local_48 = Vec_IntAlloc(pAig->nObjs[3] + 1);
  psVar3 = local_68;
  iVar9 = 0;
  local_40 = pAig;
  while (iVar9 < local_40->vCis->nSize) {
    local_60 = CONCAT44(local_60._4_4_,iVar9);
    pvVar6 = Vec_PtrEntry(local_40->vCis,iVar9);
    uVar4 = p_01->pVarNums[*(int *)((long)pvVar6 + 0x24)];
    uVar8 = p_01->nVars + uVar4;
    if ((int)(uVar8 | uVar4) < 0) {
      __assert_fail("iVarA >= 0 && iVarB >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                    ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
    }
    Lit = uVar4 * 2;
    local_70 = uVar8 * 2 + 1;
    sat_solver2_addclause(psVar3,&Lit,&local_6c,-1);
    Lit = uVar4 * 2 + 1;
    local_70 = uVar8 * 2;
    sat_solver2_addclause(psVar3,&Lit,&local_6c,-1);
    Vec_IntPush(local_48,uVar4);
    iVar9 = (int)local_60 + 1;
  }
  piVar2 = p_01->pVarNums;
  pvVar6 = Vec_PtrEntry(local_40->vCos,0);
  psVar3 = local_68;
  uVar4 = piVar2[*(int *)((long)pvVar6 + 0x24)];
  iVar9 = p_01->nVars;
  uVar8 = iVar9 + uVar4;
  if ((int)(iVar9 * 2 | uVar4 | uVar8) < 0) {
    __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.h"
                  ,0x143,"int sat_solver2_add_xor(sat_solver2 *, int, int, int, int, int, int)");
  }
  local_4c = uVar4 * 2;
  iVar11 = uVar4 * 2 + 1;
  local_70 = uVar8 * 2 + 1;
  local_6c = iVar9 * 4 + 1;
  Lit = iVar11;
  local_60 = (ulong)uVar4;
  local_54 = local_70;
  local_50 = local_6c;
  sat_solver2_addclause(local_68,&Lit,(lit *)&local_68,-1);
  Lit = iVar11;
  local_70 = uVar8 * 2;
  local_6c = iVar9 << 2;
  sat_solver2_addclause(psVar3,&Lit,(lit *)&local_68,-1);
  iVar11 = local_4c;
  Lit = local_4c;
  local_70 = local_54;
  local_6c = iVar9 << 2;
  sat_solver2_addclause(psVar3,&Lit,(lit *)&local_68,-1);
  Lit = iVar11;
  local_6c = local_50;
  local_70 = uVar8 * 2;
  sat_solver2_addclause(psVar3,&Lit,(lit *)&local_68,-1);
  p_00 = local_48;
  Vec_IntPush(local_48,(int)local_60);
  pIVar7 = Int2_ManStart(psVar3,p_00->pArray,p_00->nSize);
  psVar3->pInt2 = pIVar7;
  Lit = p_01->nVars << 2;
  iVar9 = sat_solver2_solve(psVar3,&Lit,&local_70,0,0,0,0);
  if (iVar9 == -1) {
    Sat_Solver2PrintStats(_stdout,psVar3);
    p_02 = (Gia_Man_t *)Int2_ManReadInterpolant(psVar3);
    pGVar10 = p_02;
    Gia_ManPrintStats(p_02,(Gps_Par_t *)0x0);
    iVar9 = (int)pGVar10;
    aVar5 = Abc_Clock();
    lVar12 = aVar5 - local_38;
    Abc_Print(iVar9,"%s =","Total interpolation time");
    Abc_Print(iVar9,"%9.2f sec\n",(double)lVar12 / 1000000.0);
    Vec_IntFree(p_00);
    Cnf_DataFree(p_01);
    Aig_ManStop(local_40);
    sat_solver2_delete(psVar3);
    return p_02;
  }
  __assert_fail("status == l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                ,0xda,"Gia_Man_t *Gia_ManInterTest(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManInterTest( Gia_Man_t * p )
{
    sat_solver2 * pSat;
    Gia_Man_t * pInter;
    Aig_Man_t * pMan;
    Vec_Int_t * vGVars;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int Lit, Cid, Var, status, i;
    abctime clk = Abc_Clock();
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManCoNum(p) == 1 );

    // derive CNFs
    pMan = Gia_ManToAigSimple( p );
    pCnf = Cnf_Derive( pMan, 1 );

    // start the solver
    pSat = sat_solver2_new();
    pSat->fVerbose = 1;
    sat_solver2_setnvars( pSat, 2*pCnf->nVars+1 );

    // set A-variables (all used except PI/PO, which will be global variables)
    Aig_ManForEachObj( pMan, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && !Aig_ObjIsCi(pObj) && !Aig_ObjIsCo(pObj) )
            var_set_partA( pSat, pCnf->pVarNums[pObj->Id], 1 );

    // add clauses of A
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        Cid = sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
        clause2_set_partA( pSat, Cid, 1 ); // this API should be called for each clause of A
    }

    // add clauses of B (after shifting all CNF variables by pCnf->nVars)
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        sat_solver2_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1], -1 );
    Cnf_DataLift( pCnf, -pCnf->nVars );

    // add PI equality clauses
    vGVars = Vec_IntAlloc( Aig_ManCoNum(pMan)+1 );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        Var = pCnf->pVarNums[pObj->Id];
        sat_solver2_add_buffer( pSat, Var, pCnf->nVars + Var, 0, 0, -1 );
        Vec_IntPush( vGVars, Var );
    }

    // add an XOR clause in the end
    Var = pCnf->pVarNums[Aig_ManCo(pMan,0)->Id];
    sat_solver2_add_xor( pSat, Var, pCnf->nVars + Var, 2*pCnf->nVars, 0, 0, -1 );
    Vec_IntPush( vGVars, Var );

    // start the interpolation manager
    pSat->pInt2 = Int2_ManStart( pSat, Vec_IntArray(vGVars), Vec_IntSize(vGVars) );

    // solve the problem
    Lit = toLitCond( 2*pCnf->nVars, 0 );
    status = sat_solver2_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
    assert( status == l_False );
    Sat_Solver2PrintStats( stdout, pSat );

    // derive interpolant
    pInter = (Gia_Man_t *)Int2_ManReadInterpolant( pSat );
    Gia_ManPrintStats( pInter, NULL );
    Abc_PrintTime( 1, "Total interpolation time", Abc_Clock() - clk );

    // clean up
    Vec_IntFree( vGVars );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pMan );
    sat_solver2_delete( pSat );

    // return interpolant
    return pInter;
}